

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O2

char * oonf_log_get_walltime(oonf_walltime_str *buf)

{
  int iVar1;
  tm *ptVar2;
  oonf_walltime_str *poVar3;
  timeval now;
  
  iVar1 = gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
  poVar3 = (oonf_walltime_str *)0x0;
  if (iVar1 == 0) {
    ptVar2 = localtime(&now.tv_sec);
    if (ptVar2 == (tm *)0x0) {
      poVar3 = (oonf_walltime_str *)0x0;
    }
    else {
      snprintf(buf->buf,0xe,"%02d:%02d:%02d.%03ld",(ulong)(uint)ptVar2->tm_hour % 0x18,
               (ulong)(uint)ptVar2->tm_min % 0x3c,(ulong)(uint)ptVar2->tm_sec % 0x3c,
               (now.tv_usec / 1000) % 1000);
      poVar3 = buf;
    }
  }
  return poVar3->buf;
}

Assistant:

const char *
oonf_log_get_walltime(struct oonf_walltime_str *buf) {
  struct timeval now;
  struct tm *tm;

  if (os_core_gettimeofday(&now)) {
    return NULL;
  }

  tm = localtime(&now.tv_sec);
  if (tm == NULL) {
    return NULL;
  }
  snprintf(buf->buf, sizeof(buf->buf), "%02d:%02d:%02d.%03ld", tm->tm_hour % 24u, tm->tm_min % 60u, tm->tm_sec % 60u,
    (now.tv_usec / 1000) % 1000u);
  return buf->buf;
}